

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O2

CVmHashEntry * __thiscall CVmHashTable::find(CVmHashTable *this,char *str,size_t len)

{
  CVmHashEntry *pCVar1;
  uint uVar2;
  int iVar3;
  CVmHashEntry **ppCVar4;
  
  uVar2 = compute_hash(this,str,len);
  ppCVar4 = this->table_ + uVar2;
  while( true ) {
    pCVar1 = *ppCVar4;
    if (pCVar1 == (CVmHashEntry *)0x0) {
      return (CVmHashEntry *)0x0;
    }
    iVar3 = (*pCVar1->_vptr_CVmHashEntry[2])(pCVar1,str,len);
    if (iVar3 != 0) break;
    ppCVar4 = &pCVar1->nxt_;
  }
  return pCVar1;
}

Assistant:

CVmHashEntry *CVmHashTable::find(const char *str, size_t len) const
{
    unsigned int hash;
    CVmHashEntry *entry;

    /* compute the hash value for this entry */
    hash = compute_hash(str, len);

    /* scan the list at this hash value looking for a match */
    for (entry = table_[hash] ; entry ; entry = entry->nxt_)
    {
        /* if this one matches, return it */
        if (entry->matches(str, len))
            return entry;
    }

    /* didn't find anything */
    return 0;
}